

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

bool __thiscall VWReaderHandler<false>::Uint64(VWReaderHandler<false> *this,uint64_t v)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong in_RSI;
  Context<false> *in_RDI;
  float local_14;
  
  local_14 = (float)in_RSI;
  iVar2 = (*in_RDI->current_state->_vptr_BaseState[2])(local_14,in_RDI->current_state,in_RDI);
  bVar1 = Context<false>::TransitionState(in_RDI,(BaseState<false> *)CONCAT44(extraout_var,iVar2));
  return bVar1;
}

Assistant:

bool Uint64(uint64_t v) { return ctx.TransitionState(ctx.current_state->Float(ctx, (float)v)); }